

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int resolveExprStep(Walker *pWalker,Expr *pExpr)

{
  Expr **ppEVar1;
  byte *pbVar2;
  short sVar3;
  ushort uVar4;
  NameContext *pNC;
  Parse *pParse;
  sqlite3 *psVar5;
  Db *pDVar6;
  SrcList *pSVar7;
  IdList *pIVar8;
  ExprList *pEList;
  u8 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  size_t sVar15;
  FuncDef *pFVar16;
  Expr *pEVar17;
  Select *pSVar18;
  Table *pTVar19;
  ushort uVar20;
  ulong uVar21;
  char *pcVar22;
  Schema **ppSVar23;
  char *pcVar24;
  uint uVar25;
  uint uVar26;
  SrcList_item *pSVar27;
  char **ppcVar28;
  char *zRight;
  long lVar29;
  ulong uVar30;
  char *pcVar31;
  int iVar32;
  IdList_item *pIVar33;
  Column *pCVar34;
  long lVar35;
  NameContext *pNVar36;
  uint uVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  Walker w;
  int local_104;
  SrcList_item *local_e8;
  Schema *local_d0;
  NameContext *local_c0;
  Table **local_b0;
  SrcList *local_70;
  undefined8 local_68;
  Walker local_60;
  
  pNC = (pWalker->u).pNC;
  pParse = pNC->pParse;
  uVar37 = (uint)pExpr->op;
  if (0x76 < uVar37) {
    if (uVar37 < 0x87) {
      if (uVar37 != 0x77) {
        if (uVar37 == 0x7a) {
          notValid(pParse,pNC,"the \".\" operator",0x20);
          pEVar17 = pExpr->pRight;
          pcVar24 = (pExpr->pLeft->u).zToken;
          if (pEVar17->op == '\x1b') {
            zRight = (char *)0x0;
            pcVar31 = pcVar24;
          }
          else {
            ppEVar1 = &pEVar17->pLeft;
            pEVar17 = pEVar17->pRight;
            pcVar31 = ((*ppEVar1)->u).zToken;
            zRight = pcVar24;
          }
LAB_00161630:
          pcVar24 = (pEVar17->u).zToken;
          psVar5 = pParse->db;
          pExpr->iTable = -1;
          pExpr->pTab = (Table *)0x0;
          iVar14 = 0;
          if ((zRight == (char *)0x0) || ((pNC->ncFlags & 6) != 0)) {
            local_d0 = (Schema *)0x0;
            zRight = (char *)0x0;
          }
          else {
            iVar13 = psVar5->nDb;
            if ((long)iVar13 < 1) {
              local_d0 = (Schema *)0x0;
            }
            else {
              pDVar6 = psVar5->aDb;
              local_d0 = (Schema *)0x0;
              lVar29 = 0;
              do {
                iVar12 = sqlite3StrICmp(*(char **)((long)&pDVar6->zDbSName + lVar29),zRight);
                if (iVar12 == 0) {
                  local_d0 = *(Schema **)((long)&pDVar6->pSchema + lVar29);
                  break;
                }
                lVar29 = lVar29 + 0x20;
              } while ((long)iVar13 * 0x20 != lVar29);
            }
          }
          local_b0 = &pParse->pTriggerTab;
          local_e8 = (SrcList_item *)0x0;
          bVar40 = false;
          iVar13 = 0;
          local_104 = 0;
          local_c0 = pNC;
          do {
            pSVar7 = local_c0->pSrcList;
            if (pSVar7 != (SrcList *)0x0) {
              iVar12 = pSVar7->nSrc;
              if (0 < iVar12) {
                pSVar27 = pSVar7->a;
                iVar32 = 0;
                do {
                  pTVar19 = pSVar27->pTab;
                  pSVar18 = pSVar27->pSelect;
                  if ((pSVar18 == (Select *)0x0) || ((pSVar18->selFlags & 0x800) == 0)) {
LAB_00161a2e:
                    if ((zRight == (char *)0x0) || (pTVar19->pSchema == local_d0)) {
                      if (pcVar31 != (char *)0x0) {
                        pcVar22 = pSVar27->zAlias;
                        if (pcVar22 == (char *)0x0) {
                          pcVar22 = pTVar19->zName;
                        }
                        iVar10 = sqlite3StrICmp(pcVar22,pcVar31);
                        if (iVar10 != 0) goto LAB_00161b91;
                      }
                      iVar10 = iVar13 + 1;
                      if (iVar13 == 0) {
                        local_e8 = pSVar27;
                      }
                      sVar3 = pTVar19->nCol;
                      iVar13 = iVar10;
                      if (0 < sVar3) {
                        pCVar34 = pTVar19->aCol;
                        iVar10 = 0;
                        do {
                          iVar11 = sqlite3StrICmp(pCVar34->zName,pcVar24);
                          if (iVar11 == 0) {
                            if (local_104 != 1) {
LAB_00161b4f:
                              local_104 = local_104 + 1;
                              if (iVar10 == pTVar19->iPKey) {
                                iVar10 = 0xffff;
                              }
                              pExpr->iColumn = (ynVar)iVar10;
                              local_e8 = pSVar27;
                              break;
                            }
                            if (((pSVar27->fg).jointype & 4) == 0) {
                              pIVar8 = pSVar27->pUsing;
                              if ((pIVar8 == (IdList *)0x0) ||
                                 (uVar21 = (ulong)pIVar8->nId, (long)uVar21 < 1)) goto LAB_00161b4f;
                              pIVar33 = pIVar8->a;
                              iVar11 = sqlite3StrICmp(pIVar33->zName,pcVar24);
                              if (iVar11 != 0) {
                                uVar30 = 0;
                                do {
                                  pIVar33 = pIVar33 + 1;
                                  if (uVar21 - 1 == uVar30) goto LAB_00161b4f;
                                  iVar11 = sqlite3StrICmp(pIVar33->zName,pcVar24);
                                  uVar30 = uVar30 + 1;
                                } while (iVar11 != 0);
                                if (uVar21 <= uVar30) goto LAB_00161b4f;
                              }
                            }
                          }
                          iVar10 = iVar10 + 1;
                          pCVar34 = pCVar34 + 1;
                        } while (iVar10 != sVar3);
                      }
                    }
                  }
                  else {
                    lVar29 = (long)pSVar18->pEList->nExpr;
                    bVar39 = false;
                    if (0 < lVar29) {
                      ppcVar28 = &pSVar18->pEList->a[0].zSpan;
                      lVar35 = 0;
                      do {
                        iVar10 = sqlite3MatchSpanName(*ppcVar28,pcVar24,pcVar31,zRight);
                        if (iVar10 != 0) {
                          local_104 = local_104 + 1;
                          pExpr->iColumn = (ynVar)lVar35;
                          bVar39 = true;
                          iVar13 = 2;
                          local_e8 = pSVar27;
                        }
                        lVar35 = lVar35 + 1;
                        ppcVar28 = ppcVar28 + 4;
                      } while (lVar29 != lVar35);
                    }
                    if (pcVar31 != (char *)0x0 && !bVar39) goto LAB_00161a2e;
                  }
LAB_00161b91:
                  iVar32 = iVar32 + 1;
                  pSVar27 = pSVar27 + 1;
                } while (iVar32 != iVar12);
              }
              if (local_e8 == (SrcList_item *)0x0) {
                local_e8 = (SrcList_item *)0x0;
              }
              else {
                pExpr->iTable = local_e8->iCursor;
                pTVar19 = local_e8->pTab;
                pExpr->pTab = pTVar19;
                if (((local_e8->fg).jointype & 8) != 0) {
                  pbVar2 = (byte *)((long)&pExpr->flags + 2);
                  *pbVar2 = *pbVar2 | 0x10;
                }
                local_d0 = pTVar19->pSchema;
              }
            }
            if (iVar13 == 0 && (pcVar31 != (char *)0x0 && zRight == (char *)0x0)) {
              pTVar19 = *local_b0;
              iVar13 = 0;
              if (pTVar19 != (Table *)0x0) {
                uVar9 = pParse->eTriggerOp;
                if (uVar9 == 'm') {
LAB_00161c4e:
                  iVar32 = sqlite3StrICmp("old",pcVar31);
                  iVar12 = 0;
                  if (iVar32 != 0) goto LAB_00161c63;
LAB_00161c7a:
                  pExpr->iTable = iVar12;
                }
                else {
                  iVar12 = sqlite3StrICmp("new",pcVar31);
                  if (iVar12 == 0) {
                    iVar12 = 1;
                    goto LAB_00161c7a;
                  }
                  if (uVar9 != 'l') goto LAB_00161c4e;
LAB_00161c63:
                  pTVar19 = (Table *)0x0;
                }
                if (pTVar19 != (Table *)0x0) {
                  local_d0 = pTVar19->pSchema;
                  uVar37 = (uint)pTVar19->nCol;
                  if ((int)uVar37 < 1) {
                    uVar26 = 0;
                  }
                  else {
                    pCVar34 = pTVar19->aCol;
                    uVar25 = 0;
                    do {
                      iVar13 = sqlite3StrICmp(pCVar34->zName,pcVar24);
                      if (iVar13 == 0) {
                        uVar26 = uVar25;
                        if ((int)pTVar19->iPKey == uVar25) {
                          uVar26 = 0xffffffff;
                        }
                        break;
                      }
                      uVar25 = uVar25 + 1;
                      pCVar34 = pCVar34 + 1;
                      uVar26 = uVar37;
                    } while (uVar37 != uVar25);
                  }
                  if (((int)uVar37 <= (int)uVar26) &&
                     (iVar13 = sqlite3IsRowid(pcVar24), iVar13 != 0)) {
                    uVar26 = uVar26 | -(uint)((pTVar19->tabFlags & 0x40) == 0);
                  }
                  if ((int)uVar26 < (int)uVar37) {
                    if ((int)uVar26 < 0) {
                      pExpr->affinity = 'D';
                    }
                    else {
                      uVar37 = 1 << ((byte)uVar26 & 0x1f);
                      if (0x1f < (int)uVar26) {
                        uVar37 = 0xffffffff;
                      }
                      if (pExpr->iTable == 0) {
                        pParse->oldmask = pParse->oldmask | uVar37;
                      }
                      else {
                        pParse->newmask = pParse->newmask | uVar37;
                      }
                    }
                    local_104 = local_104 + 1;
                    pExpr->iColumn = (ynVar)uVar26;
                    pExpr->pTab = pTVar19;
                    bVar40 = true;
                  }
                  iVar13 = 1;
                }
              }
            }
            if (((((local_104 == 0) && (iVar13 == 1)) && (local_e8 != (SrcList_item *)0x0)) &&
                ((local_104 = 0, (local_c0->ncFlags & 0x20) == 0 &&
                 (iVar12 = sqlite3IsRowid(pcVar24), iVar12 != 0)))) &&
               ((local_e8->pTab->tabFlags & 0x40) == 0)) {
              pExpr->iColumn = -1;
              pExpr->affinity = 'D';
              local_104 = 1;
            }
            if (((pcVar31 == (char *)0x0) && (local_104 == 0)) &&
               (pEList = local_c0->pEList, pEList != (ExprList *)0x0)) {
              if (pEList->nExpr < 1) {
                local_104 = 0;
              }
              else {
                ppcVar28 = &pEList->a[0].zName;
                lVar29 = 0;
                local_104 = 0;
                do {
                  pcVar22 = *ppcVar28;
                  bVar39 = true;
                  if ((pcVar22 == (char *)0x0) ||
                     (iVar12 = sqlite3StrICmp(pcVar22,pcVar24), iVar12 != 0)) {
                    iVar12 = 0;
                  }
                  else {
                    pEVar17 = ((ExprList_item *)(ppcVar28 + -1))->pExpr;
                    if (((local_c0->ncFlags & 1) == 0) && ((pEVar17->flags & 2) != 0)) {
                      sqlite3ErrorMsg(pParse,"misuse of aliased aggregate %s",pcVar22);
LAB_00161eff:
                      bVar39 = false;
                      iVar12 = 1;
                    }
                    else {
                      uVar9 = pEVar17->op;
                      if (uVar9 == 0x9d) {
                        uVar9 = pEVar17->op2;
                      }
                      if (uVar9 == 'w') {
                        pSVar18 = (pEVar17->x).pSelect;
LAB_00161e84:
                        if (((anon_union_8_2_a01b6dbf_for_x *)&pSVar18->pEList)->pList->nExpr != 1)
                        {
                          sqlite3ErrorMsg(pParse,"row value misused");
                          goto LAB_00161eff;
                        }
                      }
                      else if (uVar9 == 0x9e) {
                        pSVar18 = (Select *)&pEVar17->x;
                        goto LAB_00161e84;
                      }
                      resolveAlias(pParse,pEList,(int)lVar29,pExpr,"",iVar14);
                      local_104 = 1;
                      iVar12 = 0x16;
                      local_e8 = (SrcList_item *)0x0;
                      bVar39 = false;
                    }
                  }
                  if (!bVar39) goto LAB_00161f53;
                  lVar29 = lVar29 + 1;
                  ppcVar28 = ppcVar28 + 4;
                } while (lVar29 < pEList->nExpr);
              }
            }
            iVar12 = 5;
            if (local_104 == 0) {
              local_c0 = local_c0->pNext;
              iVar14 = iVar14 + 1;
              iVar12 = 0;
              local_104 = 0;
            }
LAB_00161f53:
            if (iVar12 != 0) {
              if (iVar12 != 5) {
                if (iVar12 != 0x16) {
                  return 2;
                }
                goto LAB_001620eb;
              }
              break;
            }
          } while (local_c0 != (NameContext *)0x0);
          if (((pcVar31 == (char *)0x0) && (local_104 == 0)) && ((pExpr->flags & 0x40) != 0)) {
            pExpr->op = 'a';
            pExpr->pTab = (Table *)0x0;
            return 1;
          }
          if (local_104 != 1) {
            pcVar22 = "ambiguous column name";
            if (local_104 == 0) {
              pcVar22 = "no such column";
            }
            if (zRight == (char *)0x0) {
              if (pcVar31 == (char *)0x0) {
                sqlite3ErrorMsg(pParse,"%s: %s",pcVar22,pcVar24);
              }
              else {
                sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar22,pcVar31,pcVar24);
              }
            }
            else {
              sqlite3ErrorMsg(pParse,"%s: %s.%s.%s",pcVar22,zRight,pcVar31,pcVar24);
            }
            pParse->checkSchema = '\x01';
            pNC->nErr = pNC->nErr + 1;
          }
          uVar4 = pExpr->iColumn;
          if ((-1 < (short)uVar4) && (local_e8 != (SrcList_item *)0x0)) {
            uVar20 = 0x3f;
            if (uVar4 < 0x3f) {
              uVar20 = uVar4;
            }
            local_e8->colUsed = local_e8->colUsed | 1L << ((byte)uVar20 & 0x3f);
          }
          if (pExpr->pLeft != (Expr *)0x0) {
            sqlite3ExprDeleteNN(psVar5,pExpr->pLeft);
          }
          pExpr->pLeft = (Expr *)0x0;
          if (pExpr->pRight != (Expr *)0x0) {
            sqlite3ExprDeleteNN(psVar5,pExpr->pRight);
          }
          pExpr->pRight = (Expr *)0x0;
          uVar9 = '=';
          if (!bVar40) {
            uVar9 = 0x98;
          }
          pExpr->op = uVar9;
          pbVar2 = (byte *)((long)&pExpr->flags + 2);
          *pbVar2 = *pbVar2 | 0x80;
LAB_001620eb:
          if (local_104 != 1) {
            return 2;
          }
          if (((pExpr->flags & 0x400000) == 0) &&
             (psVar5 = pParse->db, psVar5->xAuth != (sqlite3_xauth)0x0)) {
            if (local_d0 == (Schema *)0x0) {
              uVar21 = 0xfff0bdc0;
            }
            else {
              uVar37 = psVar5->nDb;
              if ((int)uVar37 < 1) {
                uVar21 = 0;
              }
              else {
                ppSVar23 = &psVar5->aDb->pSchema;
                uVar21 = 0;
                do {
                  if (*ppSVar23 == local_d0) goto LAB_00162153;
                  uVar21 = uVar21 + 1;
                  ppSVar23 = ppSVar23 + 4;
                } while (uVar37 != uVar21);
                uVar21 = (ulong)uVar37;
              }
            }
LAB_00162153:
            if (-1 < (int)uVar21) {
              if (pExpr->op == '=') {
LAB_00162191:
                pTVar19 = *local_b0;
              }
              else {
                lVar29 = (long)local_c0->pSrcList->nSrc;
                if (lVar29 < 1) {
                  pTVar19 = (Table *)0x0;
                }
                else {
                  local_b0 = &local_c0->pSrcList->a[0].pTab;
                  pTVar19 = (Table *)0x0;
                  do {
                    if (pExpr->iTable == *(int *)((long)local_b0 + 0x24)) goto LAB_00162191;
                    local_b0 = local_b0 + 0xe;
                    lVar29 = lVar29 + -1;
                  } while (lVar29 != 0);
                }
              }
              if (pTVar19 != (Table *)0x0) {
                lVar29 = (long)pExpr->iColumn;
                if ((pExpr->iColumn < 0) && (lVar29 = (long)pTVar19->iPKey, lVar29 < 0)) {
                  pcVar24 = "ROWID";
                }
                else {
                  pcVar24 = pTVar19->aCol[lVar29].zName;
                }
                iVar14 = sqlite3AuthReadCol(pParse,pTVar19->zName,pcVar24,(int)uVar21);
                if (iVar14 == 2) {
                  pExpr->op = 'e';
                }
              }
            }
          }
          pNC->nRef = pNC->nRef + 1;
          while (local_c0 != pNC) {
            pNC = pNC->pNext;
            pNC->nRef = pNC->nRef + 1;
          }
          return 1;
        }
        goto LAB_001615f3;
      }
LAB_001614e3:
      if ((pExpr->flags & 0x800) != 0) {
        iVar14 = pNC->nRef;
        notValid(pParse,pNC,"subqueries",0x26);
        sqlite3WalkSelect(pWalker,(pExpr->x).pSelect);
        if (iVar14 != pNC->nRef) {
          *(byte *)&pExpr->flags = (byte)pExpr->flags | 0x20;
          *(byte *)&pNC->ncFlags = (byte)pNC->ncFlags | 0x40;
        }
      }
      goto LAB_001615f3;
    }
    if (uVar37 == 0x87) {
      notValid(pParse,pNC,"parameters",0x26);
      goto LAB_001615f3;
    }
    if (uVar37 == 0x94) goto LAB_00161347;
    if (uVar37 != 0x97) goto LAB_001615f3;
    pSVar18 = (pExpr->x).pSelect;
    uVar21 = 0;
    iVar14 = 0;
    if (pSVar18 != (Select *)0x0) {
      iVar14 = *(int *)&pSVar18->pEList;
    }
    psVar5 = pParse->db;
    uVar9 = psVar5->enc;
    pcVar24 = (pExpr->u).zToken;
    if (pcVar24 != (char *)0x0) {
      sVar15 = strlen(pcVar24);
      uVar21 = (ulong)((uint)sVar15 & 0x3fffffff);
    }
    pFVar16 = sqlite3FindFunction(psVar5,pcVar24,iVar14,uVar9,'\0');
    if (pFVar16 == (FuncDef *)0x0) {
      bVar38 = false;
      pFVar16 = sqlite3FindFunction(pParse->db,pcVar24,-2,uVar9,'\0');
      bVar39 = pFVar16 == (FuncDef *)0x0;
      bVar40 = !bVar39;
    }
    else {
      bVar38 = pFVar16->xFinalize != (_func_void_sqlite3_context_ptr *)0x0;
      if ((pFVar16->funcFlags & 0x400) != 0) {
        pExpr->flags = pExpr->flags | 0x41000;
        if (iVar14 == 2) {
          iVar14 = exprProbability(pSVar18->pWhere);
          pExpr->iTable = iVar14;
          if (iVar14 < 0) {
            sqlite3ErrorMsg(pParse,
                            "second argument to likelihood() must be a constant between 0.0 and 1.0"
                           );
            pNC->nErr = pNC->nErr + 1;
          }
        }
        else {
          iVar14 = 0x7800000;
          if (*pFVar16->zName == 'u') {
            iVar14 = 0x800000;
          }
          pExpr->iTable = iVar14;
        }
      }
      iVar14 = sqlite3AuthCheck(pParse,0x1f,(char *)0x0,pFVar16->zName,(char *)0x0);
      if (iVar14 != 0) {
        if (iVar14 == 1) {
          sqlite3ErrorMsg(pParse,"not authorized to use function: %s",pFVar16->zName);
          pNC->nErr = pNC->nErr + 1;
        }
        pExpr->op = 'e';
        return 1;
      }
      uVar4 = pFVar16->funcFlags;
      if ((uVar4 & 0x2800) != 0) {
        pbVar2 = (byte *)((long)&pExpr->flags + 2);
        *pbVar2 = *pbVar2 | 8;
      }
      bVar39 = true;
      if ((uVar4 >> 0xb & 1) == 0) {
        notValid(pParse,pNC,"non-deterministic functions",0x22);
      }
      bVar40 = true;
    }
    if ((bVar38) && ((pNC->ncFlags & 1) == 0)) {
      sqlite3ErrorMsg(pParse,"misuse of aggregate function %.*s()",uVar21,pcVar24);
      pNC->nErr = pNC->nErr + 1;
      goto LAB_001618d7;
    }
    if (bVar40) {
      if (!bVar39) {
        pcVar31 = "wrong number of arguments to function %.*s()";
LAB_0016180b:
        sqlite3ErrorMsg(pParse,pcVar31,uVar21,pcVar24);
        pNC->nErr = pNC->nErr + 1;
      }
    }
    else {
      bVar40 = (pParse->db->init).busy != '\0';
      pcVar31 = "no such function: %.*s";
      if (bVar40) {
        pcVar31 = "wrong number of arguments to function %.*s()";
      }
      if (!(bool)(bVar40 & bVar39)) goto LAB_0016180b;
    }
    if (bVar38) {
      *(byte *)&pNC->ncFlags = (byte)pNC->ncFlags & 0xfe;
      sqlite3WalkExprList(pWalker,(ExprList *)pSVar18);
      pExpr->op = 0x99;
      pExpr->op2 = '\0';
      pNVar36 = pNC;
      while( true ) {
        local_70 = pNVar36->pSrcList;
        local_60.xExprCallback = exprSrcCount;
        local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
        local_68 = 0;
        local_60.u.pNC = (NameContext *)&local_70;
        sqlite3WalkExprList(&local_60,(pExpr->x).pList);
        if ((0 < (int)local_68) || (local_68._4_4_ == 0)) break;
        pExpr->op2 = pExpr->op2 + '\x01';
        pNVar36 = pNVar36->pNext;
        if (pNVar36 == (NameContext *)0x0) {
LAB_00162032:
          *(byte *)&pNC->ncFlags = (byte)pNC->ncFlags | 1;
          return 1;
        }
      }
      pNVar36->ncFlags = pFVar16->funcFlags & 0x1000 | pNVar36->ncFlags | 0x10;
      goto LAB_00162032;
    }
LAB_001618d7:
    sqlite3WalkExprList(pWalker,(ExprList *)pSVar18);
    return 1;
  }
  uVar21 = (ulong)(uVar37 - 0x14);
  if (0x3e < uVar37 - 0x14) goto LAB_001615f3;
  if ((0x7e30000000000000U >> (uVar21 & 0x3f) & 1) == 0) {
    if ((0x40000000000001U >> (uVar21 & 0x3f) & 1) == 0) {
      if (uVar21 == 7) {
        pEVar17 = pExpr;
        zRight = (char *)0x0;
        pcVar31 = (char *)0x0;
        goto LAB_00161630;
      }
      goto LAB_001615f3;
    }
    goto LAB_001614e3;
  }
LAB_00161347:
  if (pParse->db->mallocFailed != '\0') goto LAB_001615f3;
  pEVar17 = pExpr->pLeft;
  uVar9 = pEVar17->op;
  if (uVar9 == 0x9d) {
    uVar9 = pEVar17->op2;
  }
  if (uVar9 == 'w') {
    pSVar18 = (pEVar17->x).pSelect;
LAB_00161542:
    iVar14 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar18->pEList)->pList->nExpr;
  }
  else {
    iVar14 = 1;
    if (uVar9 == 0x9e) {
      pSVar18 = (Select *)&pEVar17->x;
      goto LAB_00161542;
    }
  }
  if (pExpr->op == 0x49) {
    pEVar17 = ((pExpr->x).pList)->a[0].pExpr;
    uVar9 = pEVar17->op;
    if (uVar9 == 0x9d) {
      uVar9 = pEVar17->op2;
    }
    if (uVar9 == 'w') {
      pSVar18 = (pEVar17->x).pSelect;
LAB_001615a3:
      iVar13 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar18->pEList)->pList->nExpr;
    }
    else {
      iVar13 = 1;
      if (uVar9 == 0x9e) {
        pSVar18 = (Select *)&pEVar17->x;
        goto LAB_001615a3;
      }
    }
    if (iVar13 == iVar14) {
      pEVar17 = *(Expr **)((pExpr->x).pList + 1);
      goto LAB_001615b0;
    }
  }
  else {
    pEVar17 = pExpr->pRight;
LAB_001615b0:
    uVar9 = pEVar17->op;
    if (uVar9 == 0x9d) {
      uVar9 = pEVar17->op2;
    }
    if (uVar9 == 'w') {
      pSVar18 = (pEVar17->x).pSelect;
    }
    else {
      iVar13 = 1;
      if (uVar9 != 0x9e) goto LAB_001615de;
      pSVar18 = (Select *)&pEVar17->x;
    }
    iVar13 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar18->pEList)->pList->nExpr;
  }
LAB_001615de:
  if (iVar14 != iVar13) {
    sqlite3ErrorMsg(pParse,"row value misused");
  }
LAB_001615f3:
  iVar14 = 2;
  if (pParse->nErr == 0) {
    iVar14 = (uint)(pParse->db->mallocFailed != '\0') * 2;
  }
  return iVar14;
}

Assistant:

static int resolveExprStep(Walker *pWalker, Expr *pExpr){
  NameContext *pNC;
  Parse *pParse;

  pNC = pWalker->u.pNC;
  assert( pNC!=0 );
  pParse = pNC->pParse;
  assert( pParse==pWalker->pParse );

#ifndef NDEBUG
  if( pNC->pSrcList && pNC->pSrcList->nAlloc>0 ){
    SrcList *pSrcList = pNC->pSrcList;
    int i;
    for(i=0; i<pNC->pSrcList->nSrc; i++){
      assert( pSrcList->a[i].iCursor>=0 && pSrcList->a[i].iCursor<pParse->nTab);
    }
  }
#endif
  switch( pExpr->op ){

#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT) && !defined(SQLITE_OMIT_SUBQUERY)
    /* The special operator TK_ROW means use the rowid for the first
    ** column in the FROM clause.  This is used by the LIMIT and ORDER BY
    ** clause processing on UPDATE and DELETE statements.
    */
    case TK_ROW: {
      SrcList *pSrcList = pNC->pSrcList;
      struct SrcList_item *pItem;
      assert( pSrcList && pSrcList->nSrc==1 );
      pItem = pSrcList->a; 
      pExpr->op = TK_COLUMN;
      pExpr->pTab = pItem->pTab;
      pExpr->iTable = pItem->iCursor;
      pExpr->iColumn = -1;
      pExpr->affinity = SQLITE_AFF_INTEGER;
      break;
    }
#endif /* defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT)
          && !defined(SQLITE_OMIT_SUBQUERY) */

    /* A column name:                    ID
    ** Or table name and column name:    ID.ID
    ** Or a database, table and column:  ID.ID.ID
    **
    ** The TK_ID and TK_OUT cases are combined so that there will only
    ** be one call to lookupName().  Then the compiler will in-line 
    ** lookupName() for a size reduction and performance increase.
    */
    case TK_ID:
    case TK_DOT: {
      const char *zColumn;
      const char *zTable;
      const char *zDb;
      Expr *pRight;

      if( pExpr->op==TK_ID ){
        zDb = 0;
        zTable = 0;
        zColumn = pExpr->u.zToken;
      }else{
        notValid(pParse, pNC, "the \".\" operator", NC_IdxExpr);
        pRight = pExpr->pRight;
        if( pRight->op==TK_ID ){
          zDb = 0;
          zTable = pExpr->pLeft->u.zToken;
          zColumn = pRight->u.zToken;
        }else{
          assert( pRight->op==TK_DOT );
          zDb = pExpr->pLeft->u.zToken;
          zTable = pRight->pLeft->u.zToken;
          zColumn = pRight->pRight->u.zToken;
        }
      }
      return lookupName(pParse, zDb, zTable, zColumn, pNC, pExpr);
    }

    /* Resolve function names
    */
    case TK_FUNCTION: {
      ExprList *pList = pExpr->x.pList;    /* The argument list */
      int n = pList ? pList->nExpr : 0;    /* Number of arguments */
      int no_such_func = 0;       /* True if no such function exists */
      int wrong_num_args = 0;     /* True if wrong number of arguments */
      int is_agg = 0;             /* True if is an aggregate function */
      int nId;                    /* Number of characters in function name */
      const char *zId;            /* The function name. */
      FuncDef *pDef;              /* Information about the function */
      u8 enc = ENC(pParse->db);   /* The database encoding */

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      zId = pExpr->u.zToken;
      nId = sqlite3Strlen30(zId);
      pDef = sqlite3FindFunction(pParse->db, zId, n, enc, 0);
      if( pDef==0 ){
        pDef = sqlite3FindFunction(pParse->db, zId, -2, enc, 0);
        if( pDef==0 ){
          no_such_func = 1;
        }else{
          wrong_num_args = 1;
        }
      }else{
        is_agg = pDef->xFinalize!=0;
        if( pDef->funcFlags & SQLITE_FUNC_UNLIKELY ){
          ExprSetProperty(pExpr, EP_Unlikely|EP_Skip);
          if( n==2 ){
            pExpr->iTable = exprProbability(pList->a[1].pExpr);
            if( pExpr->iTable<0 ){
              sqlite3ErrorMsg(pParse,
                "second argument to likelihood() must be a "
                "constant between 0.0 and 1.0");
              pNC->nErr++;
            }
          }else{
            /* EVIDENCE-OF: R-61304-29449 The unlikely(X) function is
            ** equivalent to likelihood(X, 0.0625).
            ** EVIDENCE-OF: R-01283-11636 The unlikely(X) function is
            ** short-hand for likelihood(X,0.0625).
            ** EVIDENCE-OF: R-36850-34127 The likely(X) function is short-hand
            ** for likelihood(X,0.9375).
            ** EVIDENCE-OF: R-53436-40973 The likely(X) function is equivalent
            ** to likelihood(X,0.9375). */
            /* TUNING: unlikely() probability is 0.0625.  likely() is 0.9375 */
            pExpr->iTable = pDef->zName[0]=='u' ? 8388608 : 125829120;
          }             
        }
#ifndef SQLITE_OMIT_AUTHORIZATION
        {
          int auth = sqlite3AuthCheck(pParse, SQLITE_FUNCTION, 0,pDef->zName,0);
          if( auth!=SQLITE_OK ){
            if( auth==SQLITE_DENY ){
              sqlite3ErrorMsg(pParse, "not authorized to use function: %s",
                                      pDef->zName);
              pNC->nErr++;
            }
            pExpr->op = TK_NULL;
            return WRC_Prune;
          }
        }
#endif
        if( pDef->funcFlags & (SQLITE_FUNC_CONSTANT|SQLITE_FUNC_SLOCHNG) ){
          /* For the purposes of the EP_ConstFunc flag, date and time
          ** functions and other functions that change slowly are considered
          ** constant because they are constant for the duration of one query */
          ExprSetProperty(pExpr,EP_ConstFunc);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_CONSTANT)==0 ){
          /* Date/time functions that use 'now', and other functions like
          ** sqlite_version() that might change over time cannot be used
          ** in an index. */
          notValid(pParse, pNC, "non-deterministic functions",
                   NC_IdxExpr|NC_PartIdx);
        }
      }
      if( is_agg && (pNC->ncFlags & NC_AllowAgg)==0 ){
        sqlite3ErrorMsg(pParse, "misuse of aggregate function %.*s()", nId,zId);
        pNC->nErr++;
        is_agg = 0;
      }else if( no_such_func && pParse->db->init.busy==0
#ifdef SQLITE_ENABLE_UNKNOWN_SQL_FUNCTION
                && pParse->explain==0
#endif
      ){
        sqlite3ErrorMsg(pParse, "no such function: %.*s", nId, zId);
        pNC->nErr++;
      }else if( wrong_num_args ){
        sqlite3ErrorMsg(pParse,"wrong number of arguments to function %.*s()",
             nId, zId);
        pNC->nErr++;
      }
      if( is_agg ) pNC->ncFlags &= ~NC_AllowAgg;
      sqlite3WalkExprList(pWalker, pList);
      if( is_agg ){
        NameContext *pNC2 = pNC;
        pExpr->op = TK_AGG_FUNCTION;
        pExpr->op2 = 0;
        while( pNC2 && !sqlite3FunctionUsesThisSrc(pExpr, pNC2->pSrcList) ){
          pExpr->op2++;
          pNC2 = pNC2->pNext;
        }
        assert( pDef!=0 );
        if( pNC2 ){
          assert( SQLITE_FUNC_MINMAX==NC_MinMaxAgg );
          testcase( (pDef->funcFlags & SQLITE_FUNC_MINMAX)!=0 );
          pNC2->ncFlags |= NC_HasAgg | (pDef->funcFlags & SQLITE_FUNC_MINMAX);

        }
        pNC->ncFlags |= NC_AllowAgg;
      }
      /* FIX ME:  Compute pExpr->affinity based on the expected return
      ** type of the function 
      */
      return WRC_Prune;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT:
    case TK_EXISTS:  testcase( pExpr->op==TK_EXISTS );
#endif
    case TK_IN: {
      testcase( pExpr->op==TK_IN );
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        int nRef = pNC->nRef;
        notValid(pParse, pNC, "subqueries", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
        sqlite3WalkSelect(pWalker, pExpr->x.pSelect);
        assert( pNC->nRef>=nRef );
        if( nRef!=pNC->nRef ){
          ExprSetProperty(pExpr, EP_VarSelect);
          pNC->ncFlags |= NC_VarSelect;
        }
      }
      break;
    }
    case TK_VARIABLE: {
      notValid(pParse, pNC, "parameters", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
      break;
    }
    case TK_BETWEEN:
    case TK_EQ:
    case TK_NE:
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_IS:
    case TK_ISNOT: {
      int nLeft, nRight;
      if( pParse->db->mallocFailed ) break;
      assert( pExpr->pLeft!=0 );
      nLeft = sqlite3ExprVectorSize(pExpr->pLeft);
      if( pExpr->op==TK_BETWEEN ){
        nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[0].pExpr);
        if( nRight==nLeft ){
          nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[1].pExpr);
        }
      }else{
        assert( pExpr->pRight!=0 );
        nRight = sqlite3ExprVectorSize(pExpr->pRight);
      }
      if( nLeft!=nRight ){
        testcase( pExpr->op==TK_EQ );
        testcase( pExpr->op==TK_NE );
        testcase( pExpr->op==TK_LT );
        testcase( pExpr->op==TK_LE );
        testcase( pExpr->op==TK_GT );
        testcase( pExpr->op==TK_GE );
        testcase( pExpr->op==TK_IS );
        testcase( pExpr->op==TK_ISNOT );
        testcase( pExpr->op==TK_BETWEEN );
        sqlite3ErrorMsg(pParse, "row value misused");
      }
      break; 
    }
  }
  return (pParse->nErr || pParse->db->mallocFailed) ? WRC_Abort : WRC_Continue;
}